

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

ON_BrepTrim * __thiscall ON_BrepLoop::Trim(ON_BrepLoop *this,int lti)

{
  uint uVar1;
  ON_Brep *pOVar2;
  ON_BrepTrim *pOVar3;
  
  pOVar3 = (ON_BrepTrim *)0x0;
  if (((-1 < lti) && (pOVar2 = this->m_brep, pOVar2 != (ON_Brep *)0x0)) &&
     (lti < (this->m_ti).m_count)) {
    uVar1 = (this->m_ti).m_a[(uint)lti];
    pOVar3 = (pOVar2->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a +
             uVar1;
    if ((pOVar2->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count <=
        (int)uVar1) {
      pOVar3 = (ON_BrepTrim *)0x0;
    }
    if ((int)uVar1 < 0) {
      pOVar3 = (ON_BrepTrim *)0x0;
    }
  }
  return pOVar3;
}

Assistant:

ON_BrepTrim* ON_BrepLoop::Trim( int lti ) const
{
  ON_BrepTrim* trim = ( m_brep && lti >= 0 && lti < m_ti.Count() )
                    ? m_brep->Trim(m_ti[lti])
                    : 0;
  return trim;
}